

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID *id)

{
  ImGuiWindow *window;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImGuiID IVar5;
  
  window = GImGui->CurrentWindow;
  window->Accessed = true;
  if (id == (ImGuiID *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = *id;
  }
  (window->DC).LastItemId = IVar5;
  IVar1 = bb->Max;
  (window->DC).LastItemRect.Min = bb->Min;
  (window->DC).LastItemRect.Max = IVar1;
  (window->DC).LastItemHoveredAndUsable = false;
  (window->DC).LastItemHoveredRect = false;
  bVar3 = IsClippedEx(bb,id,false);
  pIVar2 = GImGui;
  if (!bVar3) {
    bVar4 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (((bVar4) &&
        ((window->DC).LastItemHoveredRect = true, pIVar2->HoveredRootWindow == window->RootWindow))
       && (((IVar5 = pIVar2->ActiveId, IVar5 == 0 ||
            (((id != (ImGuiID *)0x0 && (IVar5 == *id)) || (pIVar2->ActiveIdAllowOverlap != false))))
           || (IVar5 == window->MoveId)))) {
      bVar4 = IsWindowContentHoverable(window);
      if (bVar4) {
        (window->DC).LastItemHoveredAndUsable = true;
      }
    }
  }
  return !bVar3;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, const ImGuiID* id)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.LastItemId = id ? *id : 0;
    window->DC.LastItemRect = bb;
    window->DC.LastItemHoveredAndUsable = window->DC.LastItemHoveredRect = false;
    if (IsClippedEx(bb, id, false))
        return false;

    // This is a sensible default, but widgets are free to override it after calling ItemAdd()
    ImGuiContext& g = *GImGui;
    if (IsMouseHoveringRect(bb.Min, bb.Max))
    {
        // Matching the behavior of IsHovered() but allow if ActiveId==window->MoveID (we clicked on the window background)
        // So that clicking on items with no active id such as Text() still returns true with IsItemHovered()
        window->DC.LastItemHoveredRect = true;
        if (g.HoveredRootWindow == window->RootWindow)
            if (g.ActiveId == 0 || (id && g.ActiveId == *id) || g.ActiveIdAllowOverlap || (g.ActiveId == window->MoveId))
                if (IsWindowContentHoverable(window))
                    window->DC.LastItemHoveredAndUsable = true;
    }

    return true;
}